

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_mp3__on_seek_memory(void *pUserData,int byteOffset,ma_dr_mp3_seek_origin origin)

{
  ulong uVar1;
  
  if (origin == ma_dr_mp3_seek_origin_current) {
    uVar1 = *(ulong *)((long)pUserData + 0x3eb8);
    if (byteOffset < 1) {
      if (uVar1 < (uint)-byteOffset) {
        byteOffset = -(int)uVar1;
      }
    }
    else if (*(ulong *)((long)pUserData + 0x3eb0) < (uint)byteOffset + uVar1) {
      byteOffset = (int)*(ulong *)((long)pUserData + 0x3eb0) - (int)uVar1;
    }
    uVar1 = uVar1 + (long)byteOffset;
  }
  else {
    uVar1 = *(ulong *)((long)pUserData + 0x3eb0);
    if ((uint)byteOffset <= uVar1) {
      uVar1 = (ulong)byteOffset;
    }
  }
  *(ulong *)((long)pUserData + 0x3eb8) = uVar1;
  return 1;
}

Assistant:

static ma_bool32 ma_dr_mp3__on_seek_memory(void* pUserData, int byteOffset, ma_dr_mp3_seek_origin origin)
{
    ma_dr_mp3* pMP3 = (ma_dr_mp3*)pUserData;
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    if (origin == ma_dr_mp3_seek_origin_current) {
        if (byteOffset > 0) {
            if (pMP3->memory.currentReadPos + byteOffset > pMP3->memory.dataSize) {
                byteOffset = (int)(pMP3->memory.dataSize - pMP3->memory.currentReadPos);
            }
        } else {
            if (pMP3->memory.currentReadPos < (size_t)-byteOffset) {
                byteOffset = -(int)pMP3->memory.currentReadPos;
            }
        }
        pMP3->memory.currentReadPos += byteOffset;
    } else {
        if ((ma_uint32)byteOffset <= pMP3->memory.dataSize) {
            pMP3->memory.currentReadPos = byteOffset;
        } else {
            pMP3->memory.currentReadPos = pMP3->memory.dataSize;
        }
    }
    return MA_TRUE;
}